

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int32_suite::fail_array8_int32_missing_seven(void)

{
  value_type input [3];
  decoder decoder;
  uchar local_3c [4];
  undefined4 local_38;
  value local_34;
  decoder local_30;
  
  local_3c[2] = '\x11';
  local_3c[0] = 0xac;
  local_3c[1] = '\b';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[3]>
            (&local_30,(uchar (*) [3])local_3c);
  local_34 = local_30.current.code;
  local_38 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x8a3,"void compact_int32_suite::fail_array8_int32_missing_seven()",&local_34,
             &local_38);
  return;
}

Assistant:

void fail_array8_int32_missing_seven()
{
    const value_type input[] = { token::code::array8_int32, 0x08, 0x11 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}